

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall
cmMakefile::EnableLanguage
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lang,bool optional)

{
  cmGlobalGenerator *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CMAKE_CFG_INTDIR","");
  iVar2 = (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0xb])();
  AddDefinition(this,&local_40,(char *)CONCAT44(extraout_var,iVar2));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = this->LocalGenerator->GlobalGenerator;
  (*pcVar1->_vptr_cmGlobalGenerator[8])(pcVar1,lang,this,(ulong)optional);
  return;
}

Assistant:

void cmMakefile::EnableLanguage(std::vector<std::string> const &  lang,
                               bool optional)
{
  this->AddDefinition("CMAKE_CFG_INTDIR",
                      this->GetGlobalGenerator()->GetCMakeCFGIntDir());
  this->GetGlobalGenerator()->EnableLanguage(lang, this, optional);
}